

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_reverse(lua_State *L)

{
  char *pcVar1;
  bool bVar2;
  size_t l;
  luaL_Buffer b;
  
  pcVar1 = luaL_checklstring(L,1,&l);
  luaL_buffinit(L,&b);
  while( true ) {
    bVar2 = l == 0;
    l = l - 1;
    if (bVar2) break;
    if (&stack0xffffffffffffffe8 <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = pcVar1[l];
    b.p = b.p + 1;
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  while (l--) luaL_addchar(&b, s[l]);
  luaL_pushresult(&b);
  return 1;
}